

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::DecodeActiveOperationalDataset
                  (Error *__return_storage_ptr__,ActiveOperationalDataset *aDataset,
                  ByteArray *aPayload)

{
  bool bVar1;
  bool bVar2;
  Error *aError;
  mapped_type *pmVar3;
  unsigned_long aValue;
  const_reference pvVar4;
  uchar *puVar5;
  size_type sVar6;
  ByteArray *pBVar7;
  element_type *peVar8;
  allocator<unsigned_char> local_301;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_300;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2f8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_2d0;
  ByteArray *value_2;
  undefined1 local_2c0 [8];
  mapped_type securityPolicy;
  undefined1 local_2a8 [8];
  mapped_type pskc;
  undefined1 local_290 [8];
  mapped_type panId;
  key_type local_259;
  undefined1 local_258 [8];
  mapped_type networkName;
  undefined1 local_240 [8];
  mapped_type networkMasterKey;
  undefined1 local_228 [8];
  mapped_type meshLocalPrefix;
  undefined1 local_210 [8];
  mapped_type extendedPanId;
  Error local_1f8;
  key_type local_1c9;
  undefined1 local_1c8 [8];
  mapped_type channelMask;
  ByteArray *value_1;
  undefined1 local_1a8 [8];
  mapped_type channel;
  uint64_t value;
  undefined1 local_180 [8];
  mapped_type activeTimeStamp;
  Error local_168;
  undefined1 local_130 [8];
  ActiveOperationalDataset dataset;
  TlvSet tlvSet;
  ByteArray *aPayload_local;
  ActiveOperationalDataset *aDataset_local;
  Error *error;
  
  bVar2 = false;
  Error::Error(__return_storage_ptr__);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
         *)&dataset.mPresentFlags);
  ActiveOperationalDataset::ActiveOperationalDataset((ActiveOperationalDataset *)local_130);
  dataset.mSecurityPolicy.mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  tlv::GetTlvSet(&local_168,(TlvSet *)&dataset.mPresentFlags,aPayload,kMeshCoP);
  aError = Error::operator=(__return_storage_ptr__,&local_168);
  activeTimeStamp.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 0;
  bVar1 = commissioner::operator!=
                    (aError,(ErrorCode *)
                            ((long)&activeTimeStamp.
                                    super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi + 4));
  Error::~Error(&local_168);
  if (!bVar1) {
    value._7_1_ = 0xe;
    pmVar3 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mPresentFlags,(key_type *)((long)&value + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_180,pmVar3);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_180);
    if (bVar1) {
      peVar8 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_180);
      pBVar7 = tlv::Tlv::GetValue(peVar8);
      aValue = utils::Decode<unsigned_long>(pBVar7);
      channel.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Timestamp::Decode(aValue);
      dataset.mSecurityPolicy.mFlags.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_2_ =
           (ushort)dataset.mSecurityPolicy.mFlags.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage | 0x8000;
      local_130 = (undefined1  [8])
                  channel.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_180);
    value_1._7_1_ = 0;
    pmVar3 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mPresentFlags,(key_type *)((long)&value_1 + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1a8,pmVar3);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1a8);
    if (bVar1) {
      peVar8 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1a8);
      channelMask.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tlv::Tlv::GetValue(peVar8)
      ;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          channelMask.
                          super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi,0);
      dataset.mNetworkName.field_2._M_local_buf[8] = *pvVar4;
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          channelMask.
                          super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         channelMask.
                         super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
      dataset.mNetworkName.field_2._10_2_ = utils::Decode<unsigned_short>(puVar5 + 1,sVar6 - 1);
      dataset.mSecurityPolicy.mFlags.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_2_ =
           (ushort)dataset.mSecurityPolicy.mFlags.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage | 0x4000;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1a8);
    local_1c9 = kChannelMask;
    pmVar3 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mPresentFlags,&local_1c9);
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1c8,pmVar3);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1c8);
    if (bVar1) {
      peVar8 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1c8);
      pBVar7 = tlv::Tlv::GetValue(peVar8);
      DecodeChannelMask(&local_1f8,(ChannelMask *)&dataset.mChannel,pBVar7);
      extendedPanId.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 0;
      bVar1 = commissioner::operator!=
                        (&local_1f8,
                         (ErrorCode *)
                         ((long)&extendedPanId.
                                 super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 4));
      Error::~Error(&local_1f8);
      if (!bVar1) {
        dataset.mSecurityPolicy.mFlags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_2_ =
             (ushort)dataset.mSecurityPolicy.mFlags.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 0x2000;
        goto LAB_0027bc4c;
      }
      extendedPanId.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 4;
    }
    else {
LAB_0027bc4c:
      extendedPanId.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 0;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1c8);
    if ((int)extendedPanId.
             super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi == 0) {
      meshLocalPrefix.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 2;
      pmVar3 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&dataset.mPresentFlags,
                            (key_type *)
                            ((long)&meshLocalPrefix.
                                    super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi + 7));
      std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_210,pmVar3);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_210);
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_210);
        pBVar7 = tlv::Tlv::GetValue(peVar8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataset,pBVar7);
        dataset.mSecurityPolicy.mFlags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_2_ =
             (ushort)dataset.mSecurityPolicy.mFlags.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 0x1000;
      }
      std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_210);
      networkMasterKey.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 7;
      pmVar3 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&dataset.mPresentFlags,
                            (key_type *)
                            ((long)&networkMasterKey.
                                    super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi + 7));
      std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_228,pmVar3);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_228);
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_228);
        pBVar7 = tlv::Tlv::GetValue(peVar8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &dataset.mChannelMask.
                    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pBVar7);
        dataset.mSecurityPolicy.mFlags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_2_ =
             (ushort)dataset.mSecurityPolicy.mFlags.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 0x800;
      }
      std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_228);
      networkName.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 5;
      pmVar3 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&dataset.mPresentFlags,
                            (key_type *)
                            ((long)&networkName.
                                    super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi + 7));
      std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_240,pmVar3);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_240);
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_240);
        pBVar7 = tlv::Tlv::GetValue(peVar8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &dataset.mMeshLocalPrefix.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pBVar7);
        dataset.mSecurityPolicy.mFlags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_2_ =
             (ushort)dataset.mSecurityPolicy.mFlags.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 0x400;
      }
      std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_240);
      local_259 = kNetworkDiagTimeout;
      pmVar3 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&dataset.mPresentFlags,&local_259);
      std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_258,pmVar3);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_258);
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_258);
        tlv::Tlv::GetValueAsString_abi_cxx11_
                  ((string *)
                   &panId.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,peVar8);
        std::__cxx11::string::operator=
                  ((string *)&dataset.mPanId,
                   (string *)
                   &panId.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::string::~string
                  ((string *)
                   &panId.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        dataset.mSecurityPolicy.mFlags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_2_ =
             (ushort)dataset.mSecurityPolicy.mFlags.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 0x200;
      }
      std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_258);
      pskc.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._7_1_ = 1;
      pmVar3 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&dataset.mPresentFlags,
                            (key_type *)
                            ((long)&pskc.
                                    super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi + 7));
      std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_290,pmVar3);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_290);
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_290);
        pBVar7 = tlv::Tlv::GetValue(peVar8);
        dataset.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ =
             utils::Decode<unsigned_short>(pBVar7);
        dataset.mSecurityPolicy.mFlags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_2_ =
             (ushort)dataset.mSecurityPolicy.mFlags.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 0x100;
      }
      std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_290);
      securityPolicy.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 4;
      pmVar3 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&dataset.mPresentFlags,
                            (key_type *)
                            ((long)&securityPolicy.
                                    super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi + 7));
      std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_2a8,pmVar3);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2a8);
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_2a8);
        pBVar7 = tlv::Tlv::GetValue(peVar8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &dataset.mNetworkMasterKey.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pBVar7);
        dataset.mSecurityPolicy.mFlags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_2_ =
             (ushort)dataset.mSecurityPolicy.mFlags.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 0x80;
      }
      std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_2a8);
      value_2._7_1_ = 0xc;
      pmVar3 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&dataset.mPresentFlags,(key_type *)((long)&value_2 + 7));
      std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_2c0,pmVar3);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2c0);
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_2c0);
        local_2d0 = tlv::Tlv::GetValue(peVar8);
        dataset.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_2_ = utils::Decode<unsigned_short>(local_2d0);
        local_2f8._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_2d0);
        local_2f0 = __gnu_cxx::
                    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_2f8,2);
        local_300._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(local_2d0);
        std::allocator<unsigned_char>::allocator(&local_301);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_2e8,local_2f0,
                   local_300,&local_301);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataset.mSecurityPolicy
                   ,&local_2e8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2e8);
        std::allocator<unsigned_char>::~allocator(&local_301);
        dataset.mSecurityPolicy.mFlags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_2_ =
             (ushort)dataset.mSecurityPolicy.mFlags.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 0x40;
      }
      std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_2c0);
      ActiveOperationalDataset::operator=(aDataset,(ActiveOperationalDataset *)local_130);
    }
    else if ((int)extendedPanId.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != 4) goto LAB_0027c2af;
  }
  bVar2 = true;
  extendedPanId.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 1;
LAB_0027c2af:
  ActiveOperationalDataset::~ActiveOperationalDataset((ActiveOperationalDataset *)local_130);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
          *)&dataset.mPresentFlags);
  if (!bVar2) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodeActiveOperationalDataset(ActiveOperationalDataset &aDataset, const ByteArray &aPayload)
{
    Error                    error;
    tlv::TlvSet              tlvSet;
    ActiveOperationalDataset dataset;

    // Clear all data fields
    dataset.mPresentFlags = 0;

    SuccessOrExit(error = tlv::GetTlvSet(tlvSet, aPayload));

    if (auto activeTimeStamp = tlvSet[tlv::Type::kActiveTimestamp])
    {
        uint64_t value;
        value                    = utils::Decode<uint64_t>(activeTimeStamp->GetValue());
        dataset.mActiveTimestamp = Timestamp::Decode(value);
        dataset.mPresentFlags |= ActiveOperationalDataset::kActiveTimestampBit;
    }

    if (auto channel = tlvSet[tlv::Type::kChannel])
    {
        const ByteArray &value   = channel->GetValue();
        dataset.mChannel.mPage   = value[0];
        dataset.mChannel.mNumber = utils::Decode<uint16_t>(value.data() + 1, value.size() - 1);
        dataset.mPresentFlags |= ActiveOperationalDataset::kChannelBit;
    }

    if (auto channelMask = tlvSet[tlv::Type::kChannelMask])
    {
        SuccessOrExit(DecodeChannelMask(dataset.mChannelMask, channelMask->GetValue()));
        dataset.mPresentFlags |= ActiveOperationalDataset::kChannelMaskBit;
    }

    if (auto extendedPanId = tlvSet[tlv::Type::kExtendedPanId])
    {
        dataset.mExtendedPanId = extendedPanId->GetValue();
        dataset.mPresentFlags |= ActiveOperationalDataset::kExtendedPanIdBit;
    }

    if (auto meshLocalPrefix = tlvSet[tlv::Type::kNetworkMeshLocalPrefix])
    {
        dataset.mMeshLocalPrefix = meshLocalPrefix->GetValue();
        dataset.mPresentFlags |= ActiveOperationalDataset::kMeshLocalPrefixBit;
    }

    if (auto networkMasterKey = tlvSet[tlv::Type::kNetworkMasterKey])
    {
        dataset.mNetworkMasterKey = networkMasterKey->GetValue();
        dataset.mPresentFlags |= ActiveOperationalDataset::kNetworkMasterKeyBit;
    }

    if (auto networkName = tlvSet[tlv::Type::kNetworkName])
    {
        dataset.mNetworkName = networkName->GetValueAsString();
        dataset.mPresentFlags |= ActiveOperationalDataset::kNetworkNameBit;
    }

    if (auto panId = tlvSet[tlv::Type::kPanId])
    {
        dataset.mPanId = utils::Decode<uint16_t>(panId->GetValue());
        dataset.mPresentFlags |= ActiveOperationalDataset::kPanIdBit;
    }

    if (auto pskc = tlvSet[tlv::Type::kPSKc])
    {
        dataset.mPSKc = pskc->GetValue();
        dataset.mPresentFlags |= ActiveOperationalDataset::kPSKcBit;
    }

    if (auto securityPolicy = tlvSet[tlv::Type::kSecurityPolicy])
    {
        auto &value                           = securityPolicy->GetValue();
        dataset.mSecurityPolicy.mRotationTime = utils::Decode<uint16_t>(value);
        dataset.mSecurityPolicy.mFlags        = {value.begin() + sizeof(uint16_t), value.end()};
        dataset.mPresentFlags |= ActiveOperationalDataset::kSecurityPolicyBit;
    }

    aDataset = dataset;

exit:
    return error;
}